

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableSet
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableSet *curr)

{
  long *plVar1;
  undefined8 uVar2;
  Literal *pLVar3;
  undefined1 local_d8 [8];
  Flow index;
  Flow value;
  TableInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_d8,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             *(Expression **)(curr + 0x20));
  if (index.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&index.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x28));
    if (value.breakTo.super_IString.str._M_len == 0) {
      getTableInstanceInfo
                ((TableInstanceInfo *)&value.breakTo.super_IString.str._M_str,this,
                 (Name)*(string_view *)(curr + 0x10));
      Flow::getSingleValue((Flow *)local_d8);
      uVar2 = wasm::Literal::getUnsigned();
      plVar1 = *(long **)(value.breakTo.super_IString.str._M_str + 0x200);
      pLVar3 = Flow::getSingleValue((Flow *)&index.breakTo.super_IString.str._M_str);
      (**(code **)(*plVar1 + 0xe0))
                (plVar1,info.instance,info.name.super_IString.str._M_len,uVar2,pLVar3);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed
                        ._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&index.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&index.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_d8);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableSet(TableSet* curr) {
    NOTE_ENTER("TableSet");
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    auto info = getTableInstanceInfo(curr->table);
    auto address = index.getSingleValue().getUnsigned();
    info.interface()->tableStore(info.name, address, value.getSingleValue());
    return Flow();
  }